

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall glcts::IntegerConstant::IntegerConstant(IntegerConstant *this,Literals lit,int ai)

{
  ostream *poVar1;
  void *pvVar2;
  string local_1c0 [48];
  undefined1 local_190 [8];
  StringStream s;
  int ai_local;
  Literals lit_local;
  IntegerConstant *this_local;
  
  s.super_ostringstream._368_4_ = ai;
  s.super_ostringstream._372_4_ = lit;
  std::__cxx11::string::string((string *)this);
  this->asInt = s.super_ostringstream._368_4_;
  StringStream::StringStream((StringStream *)local_190);
  switch(s.super_ostringstream._372_4_) {
  case (BADTYPE)0x0:
    std::ostream::operator<<(local_190,this->asInt);
    break;
  case (BADTYPE)0x1:
    poVar1 = (ostream *)std::ostream::operator<<(local_190,this->asInt);
    std::operator<<(poVar1,"u");
    break;
  case (BADTYPE)0x2:
    poVar1 = (ostream *)std::ostream::operator<<(local_190,this->asInt);
    std::operator<<(poVar1,"U");
    break;
  case (BADTYPE)0x3:
    poVar1 = std::operator<<((ostream *)local_190,"0");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::oct);
    std::ostream::operator<<(pvVar2,this->asInt);
    break;
  case (BADTYPE)0x4:
    poVar1 = std::operator<<((ostream *)local_190,"0");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::oct);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,this->asInt);
    std::operator<<(poVar1,"u");
    break;
  case (BADTYPE)0x5:
    poVar1 = std::operator<<((ostream *)local_190,"0");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::oct);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,this->asInt);
    std::operator<<(poVar1,"U");
    break;
  case (BADTYPE)0x6:
    poVar1 = std::operator<<((ostream *)local_190,"0x");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    std::ostream::operator<<(pvVar2,this->asInt);
    break;
  case (BADTYPE)0x7:
    poVar1 = std::operator<<((ostream *)local_190,"0X");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    std::ostream::operator<<(pvVar2,this->asInt);
    break;
  case (BADTYPE)0x8:
    poVar1 = std::operator<<((ostream *)local_190,"0x");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,this->asInt);
    std::operator<<(poVar1,"u");
    break;
  case (BADTYPE)0x9:
    poVar1 = std::operator<<((ostream *)local_190,"0X");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,this->asInt);
    std::operator<<(poVar1,"u");
    break;
  case (BADTYPE)0xa:
    poVar1 = std::operator<<((ostream *)local_190,"0x");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,this->asInt);
    std::operator<<(poVar1,"U");
    break;
  case (BADTYPE)0xb:
    poVar1 = std::operator<<((ostream *)local_190,"0X");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,this->asInt);
    std::operator<<(poVar1,"U");
    break;
  case (BADTYPE)0xc:
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)this,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  StringStream::~StringStream((StringStream *)local_190);
  return;
}

Assistant:

IntegerConstant(Literals lit, int ai) : asInt(ai)
	{
		StringStream s;
		switch (lit)
		{
		case decimal:
			s << asInt;
			break;
		case decimal_u:
			s << asInt << "u";
			break;
		case decimal_U:
			s << asInt << "U";
			break;
		case octal:
			s << "0" << std::oct << asInt;
			break;
		case octal_u:
			s << "0" << std::oct << asInt << "u";
			break;
		case octal_U:
			s << "0" << std::oct << asInt << "U";
			break;
		case hex_x:
			s << "0x" << std::hex << asInt;
			break;
		case hex_X:
			s << "0X" << std::hex << asInt;
			break;
		case hex_u:
			s << "0x" << std::hex << asInt << "u";
			break;
		case hex_u_X:
			s << "0X" << std::hex << asInt << "u";
			break;
		case hex_U:
			s << "0x" << std::hex << asInt << "U";
			break;
		case hex_U_X:
			s << "0X" << std::hex << asInt << "U";
			break;
		case last:
		default:
			DE_ASSERT(0);
		}

		asString = s.str();
	}